

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.h
# Opt level: O2

void __thiscall
chrono::fea::ChContinuumElastoplastic::ChContinuumElastoplastic
          (ChContinuumElastoplastic *this,ChContinuumElastoplastic *param_1)

{
  ChContinuumElastic::ChContinuumElastic
            (&this->super_ChContinuumElastic,&param_1->super_ChContinuumElastic);
  (this->super_ChContinuumElastic).super_ChContinuumMaterial._vptr_ChContinuumMaterial =
       (_func_int **)&PTR__ChContinuumElastic_01172a38;
  return;
}

Assistant:

class ChApi ChContinuumElastoplastic : public ChContinuumElastic {
  public:
    ChContinuumElastoplastic(double myoung = 10000000, double mpoisson = 0.4, double mdensity = 1000)
        : ChContinuumElastic(myoung, mpoisson, mdensity) {}

    /// Return a scalar value that is 0 on the yield surface, <0 inside (elastic), >0 outside (incompatible->plastic
    /// flow)
    virtual double ComputeYeldFunction(const ChStressTensor<>& mstress) const = 0;

    /// Compute plastic strain flow (flow derivative dE_plast/dt) from strain,
    /// according to VonMises strain yield theory.
    virtual void ComputePlasticStrainFlow(ChStrainTensor<>& mplasticstrainflow,
                                          const ChStrainTensor<>& mtotstrain) const = 0;

    /// Correct the strain-stress by enforcing that elastic stress must remain on the yield
    /// surface, computing a plastic flow to be added to plastic strain while integrating.
    virtual void ComputeReturnMapping(ChStrainTensor<>& mplasticstrainflow,
                                      const ChStrainTensor<>& mincrementstrain,
                                      const ChStrainTensor<>& mlastelasticstrain,
                                      const ChStrainTensor<>& mlastplasticstrain) const = 0;

    /// Set the plastic flow rate, i.e. the 'creep' speed. The lower the value, the slower
    /// the plastic flow during dynamic simulations, with delayed plasticity.
    virtual void Set_flow_rate(double mflow_rate) = 0;
    /// Set the plastic flow rate.
    virtual double Get_flow_rate() const = 0;

    virtual void ArchiveOUT(ChArchiveOut& marchive) override;
    virtual void ArchiveIN(ChArchiveIn& marchive) override;
}